

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O3

void __thiscall
iutest::detail::
TypeParamTestInstance<iu_TypedFoo_x_iutest_x_DISABLED_Bar_Test,_iutest::detail::VariadicTypeList<int>_>
::TypeParamTestInstance
          (TypeParamTestInstance<iu_TypedFoo_x_iutest_x_DISABLED_Bar_Test,_iutest::detail::VariadicTypeList<int>_>
           *this,string *testsuite,char *name,char *file,int line)

{
  TestSuite *this_00;
  UnitTest *pUVar1;
  
  EachTest<iutest::detail::VariadicTypeList<int>,_void>::EachTest
            (&this->m_tests,testsuite,name,0,file,line);
  pUVar1 = UnitTest::instance();
  this_00 = (this->m_tests).m_mediator.super_iuITestSuiteMediator.m_test_suite;
  (pUVar1->super_UnitTestImpl).m_total_test_num = (pUVar1->super_UnitTestImpl).m_total_test_num + 1;
  TestSuite::push_back(this_00,&(this->m_tests).m_info);
  return;
}

Assistant:

TypeParamTestInstance(const std::string& testsuite, const char* name, const char* file, int line)
        : m_tests(testsuite, name, 0, file, line)
    {
        m_tests.AddTest();
    }